

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O1

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
basic_socket_acceptor<asio::io_context>
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,io_context *context,
          int param_3)

{
  error_code __ec;
  error_code ec;
  uint local_48 [2];
  error_category *local_40;
  system_error local_38 [32];
  
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&this->impl_,0,0,context);
  local_48[0] = 0;
  local_40 = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service<asio::ip::tcp>::open
            ((this->impl_).service_,(char *)&(this->impl_).implementation_,param_3,local_48);
  __ec._4_4_ = 0;
  __ec._M_value = local_48[0];
  if (local_48[0] != 0) {
    __ec._M_cat = local_40;
    std::system_error::system_error(local_38,__ec,"open");
    detail::throw_exception<std::system_error>(local_38);
    std::system_error::~system_error(local_38);
  }
  return;
}

Assistant:

basic_socket_acceptor(ExecutionContext& context,
      const protocol_type& protocol,
      constraint_t<
        is_convertible<ExecutionContext&, execution_context&>::value,
        defaulted_constraint
      > = defaulted_constraint())
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
  }